

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Attribute_PDU::SetAttributeRecordSets
          (Attribute_PDU *this,
          vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
          *AR)

{
  KUINT16 *pKVar1;
  pointer pAVar2;
  KUINT16 KVar3;
  pointer this_00;
  
  ClearAttributeRecordSet(this);
  std::
  vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  ::operator=(&this->m_vAttributeRecordSets,AR);
  this_00 = (this->m_vAttributeRecordSets).
            super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui16NumAttrRecSets = (KUINT16)(((long)pAVar2 - (long)this_00) / 0x38);
  for (; this_00 != pAVar2; this_00 = this_00 + 1) {
    KVar3 = DATA_TYPE::AttributeRecordSet::GetRecordLength(this_00);
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar3;
  }
  return;
}

Assistant:

void Attribute_PDU::SetAttributeRecordSets( const vector<AttributeRecordSet> & AR )
{
    ClearAttributeRecordSet();

    m_vAttributeRecordSets = AR;
    m_ui16NumAttrRecSets = m_vAttributeRecordSets.size();

    // Calculate the new pdu length
    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetRecordLength();
    }
}